

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

void jsoncons::detail::fill_exponent<jsoncons::stream_sink<char>>(int K,stream_sink<char> *result)

{
  int iVar1;
  int in_EDI;
  stream_sink<char> *unaff_retaddr;
  stream_sink<char> *in_stack_00000158;
  int in_stack_00000164;
  char cVar2;
  
  cVar2 = (char)((uint)in_EDI >> 0x18);
  if (in_EDI < 0) {
    stream_sink<char>::push_back(unaff_retaddr,cVar2);
    in_EDI = -in_EDI;
  }
  else {
    stream_sink<char>::push_back(unaff_retaddr,cVar2);
  }
  cVar2 = (char)((uint)in_EDI >> 0x18);
  if (in_EDI < 10) {
    stream_sink<char>::push_back(unaff_retaddr,cVar2);
    stream_sink<char>::push_back(unaff_retaddr,(char)((uint)in_EDI >> 0x18));
  }
  else if (in_EDI < 100) {
    stream_sink<char>::push_back(unaff_retaddr,cVar2);
    stream_sink<char>::push_back(unaff_retaddr,(char)((uint)(in_EDI % 10) >> 0x18));
  }
  else if (in_EDI < 1000) {
    stream_sink<char>::push_back(unaff_retaddr,cVar2);
    iVar1 = in_EDI % 100;
    stream_sink<char>::push_back(unaff_retaddr,(char)((uint)iVar1 >> 0x18));
    stream_sink<char>::push_back(unaff_retaddr,(char)((uint)(iVar1 % 10) >> 0x18));
  }
  else {
    from_integer<int,jsoncons::stream_sink<char>>(in_stack_00000164,in_stack_00000158);
  }
  return;
}

Assistant:

void fill_exponent(int K, Result& result)
    {
        if (K < 0)
        {
            result.push_back('-');
            K = -K;
        }
        else
        {
            result.push_back('+'); // compatibility with sprintf
        }

        if (K < 10)
        {
            result.push_back('0'); // compatibility with sprintf
            result.push_back((char)('0' + K));
        }
        else if (K < 100)
        {
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else if (K < 1000)
        {
            result.push_back((char)('0' + K / 100)); K %= 100;
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else
        {
            jsoncons::detail::from_integer(K, result);
        }
    }